

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

RedactionState
google::protobuf::TextFormat::IsOptionSensitive
          (Message *opts,Reflection *reflection,FieldDescriptor *option)

{
  byte bVar1;
  pointer ppFVar2;
  Reflection *this;
  FieldDescriptor *field;
  int iVar3;
  int number;
  EnumDescriptor *this_00;
  EnumValueDescriptor *pEVar4;
  Nonnull<const_char_*> pcVar5;
  Message *this_01;
  undefined8 extraout_RAX;
  bool bVar6;
  bool v1;
  pointer ppFVar7;
  RedactionState unaff_R12W;
  int index;
  uint uVar8;
  ulong uVar9;
  Metadata MVar10;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  message_fields;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_68;
  uint local_4c;
  ulong local_48;
  Reflection *local_40;
  FieldDescriptor *local_38;
  
  if ((ulong)option->type_ == 0xe) {
    bVar1 = option->field_0x1;
    bVar6 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar6) {
      pcVar5 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                         (bVar6,0xbf < bVar1,
                          "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar5 != (Nonnull<const_char_*>)0x0) {
LAB_0025e460:
      IsOptionSensitive();
LAB_0025e46d:
      IsOptionSensitive();
      if (local_68.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_68.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      _Unwind_Resume(extraout_RAX);
    }
    iVar3 = 1;
    if ((option->field_0x1 & 0x20) != 0) {
      iVar3 = Reflection::FieldSize(reflection,opts,option);
    }
    bVar6 = 0 < iVar3;
    if (0 < iVar3) {
      index = 0;
      do {
        bVar1 = option->field_0x1;
        v1 = (bool)((bVar1 & 0x20) >> 5);
        if (0xbf < bVar1 == v1) {
          pcVar5 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                             (v1,0xbf < bVar1,
                              "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
        }
        if (pcVar5 != (Nonnull<const_char_*>)0x0) {
          IsOptionSensitive();
LAB_0025e453:
          IsOptionSensitive();
          goto LAB_0025e460;
        }
        if ((option->field_0x1 & 0x20) == 0) {
          number = Reflection::GetEnumValue(reflection,opts,option);
        }
        else {
          number = Reflection::GetRepeatedEnumValue(reflection,opts,option,index);
        }
        this_00 = FieldDescriptor::enum_type(option);
        pEVar4 = EnumDescriptor::FindValueByNumber(this_00,number);
        if ((pEVar4->options_->field_0)._impl_.debug_redact_ == true) {
          unaff_R12W.redact = true;
          unaff_R12W.report = false;
          if (bVar6) goto LAB_0025e3fb;
          break;
        }
        index = index + 1;
        bVar6 = index < iVar3;
      } while (index != iVar3);
    }
  }
  else if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)option->type_ * 4) == 10) {
    bVar1 = option->field_0x1;
    bVar6 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar6) {
      pcVar5 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                         (bVar6,0xbf < bVar1,
                          "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar5 != (Nonnull<const_char_*>)0x0) goto LAB_0025e46d;
    local_4c = 1;
    if ((option->field_0x1 & 0x20) != 0) {
      local_4c = Reflection::FieldSize(reflection,opts,option);
    }
    if (0 < (int)local_4c) {
      uVar9 = 0;
      local_40 = reflection;
      local_38 = option;
      do {
        field = local_38;
        this = local_40;
        bVar1 = local_38->field_0x1;
        bVar6 = (bool)((bVar1 & 0x20) >> 5);
        if (0xbf < bVar1 == bVar6) {
          pcVar5 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                             (bVar6,0xbf < bVar1,
                              "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
        }
        if (pcVar5 != (Nonnull<const_char_*>)0x0) goto LAB_0025e453;
        local_48 = uVar9;
        if ((field->field_0x1 & 0x20) == 0) {
          this_01 = Reflection::GetMessage(this,opts,field,(MessageFactory *)0x0);
        }
        else {
          this_01 = Reflection::GetRepeatedMessage(this,opts,field,(int)uVar9);
        }
        MVar10 = Message::GetMetadata(this_01);
        local_68.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_68.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        Reflection::ListFields(MVar10.reflection,this_01,&local_68);
        ppFVar2 = local_68.
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (ppFVar7 = local_68.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_start; ppFVar7 != ppFVar2;
            ppFVar7 = ppFVar7 + 1) {
          unaff_R12W = IsOptionSensitive(this_01,MVar10.reflection,*ppFVar7);
          if (((ushort)unaff_R12W & 1) != 0) {
            iVar3 = 1;
            goto LAB_0025e385;
          }
        }
        iVar3 = 0;
LAB_0025e385:
        uVar9 = local_48;
        if (local_68.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_68.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_68.
                                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_68.
                                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (ppFVar7 != ppFVar2) goto LAB_0025e3ef;
        uVar8 = (int)uVar9 + 1;
        uVar9 = (ulong)uVar8;
      } while (uVar8 != local_4c);
    }
    iVar3 = 5;
LAB_0025e3ef:
    if ((iVar3 != 5) && (iVar3 != 0)) goto LAB_0025e3fb;
  }
  unaff_R12W.redact = false;
  unaff_R12W.report = false;
LAB_0025e3fb:
  return (RedactionState)((ushort)unaff_R12W & 0xff);
}

Assistant:

TextFormat::RedactionState TextFormat::IsOptionSensitive(
    const Message& opts, const Reflection* reflection,
    const FieldDescriptor* option) {
  if (option->type() == FieldDescriptor::TYPE_ENUM) {
    auto count =
        option->is_repeated() ? reflection->FieldSize(opts, option) : 1;
    for (auto i = 0; i < count; i++) {
      int enum_val = option->is_repeated()
                         ? reflection->GetRepeatedEnumValue(opts, option, i)
                         : reflection->GetEnumValue(opts, option);
      const EnumValueDescriptor* option_value =
          option->enum_type()->FindValueByNumber(enum_val);
      if (option_value->options().debug_redact()) {
        return TextFormat::RedactionState{true, false};
      }
    }
  } else if (option->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    auto count =
        option->is_repeated() ? reflection->FieldSize(opts, option) : 1;
    for (auto i = 0; i < count; i++) {
      const Message& sub_message =
          option->is_repeated()
              ? reflection->GetRepeatedMessage(opts, option, i)
              : reflection->GetMessage(opts, option);
      const Reflection* sub_reflection = sub_message.GetReflection();
      std::vector<const FieldDescriptor*> message_fields;
      sub_reflection->ListFields(sub_message, &message_fields);
      for (const FieldDescriptor* message_field : message_fields) {
        auto result = TextFormat::IsOptionSensitive(sub_message, sub_reflection,
                                                    message_field);
        if (result.redact) {
          return result;
        }
      }
    }
  }
  return TextFormat::RedactionState{false, false};
}